

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofR.cpp
# Opt level: O0

void __thiscall OpenMD::GofR::collectHistogram(GofR *this,StuntDouble *sd1,StuntDouble *sd2)

{
  bool bVar1;
  reference pvVar2;
  Snapshot *in_RDX;
  Snapshot *in_RSI;
  Vector<double,_3U> *in_RDI;
  double dVar3;
  int whichBin;
  RealType distance;
  Vector3d r12;
  Vector3d pos2;
  Vector3d pos1;
  bool usePeriodicBoundaryConditions_;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  StuntDouble *in_stack_ffffffffffffff78;
  
  if (in_RSI != in_RDX) {
    SimInfo::getSimParams((SimInfo *)in_RDI->data_[1]);
    bVar1 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x14e6d7);
    StuntDouble::getPos(in_stack_ffffffffffffff78);
    StuntDouble::getPos(in_stack_ffffffffffffff78);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffff78,
                      (Vector<double,_3U> *)
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    Vector3<double>::Vector3
              ((Vector3<double> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_RDI);
    if (bVar1) {
      Snapshot::wrapVector(in_RSI,(Vector3d *)in_RDX);
    }
    dVar3 = Vector<double,_3U>::length((Vector<double,_3U> *)0x14e74a);
    if (dVar3 < in_RDI[0xa7].data_[1]) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI[0xa8].data_ + 1),
                          (long)(int)(dVar3 / in_RDI[0xa8].data_[0]));
      *pvVar2 = *pvVar2 + 2;
    }
  }
  return;
}

Assistant:

void GofR::collectHistogram(StuntDouble* sd1, StuntDouble* sd2) {
    if (sd1 == sd2) { return; }

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    Vector3d pos1 = sd1->getPos();
    Vector3d pos2 = sd2->getPos();
    Vector3d r12  = pos2 - pos1;
    if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(r12);

    RealType distance = r12.length();

    if (distance < len_) {
      int whichBin = int(distance / deltaR_);
      histogram_[whichBin] += 2;
    }
  }